

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

string * __thiscall
fmt::v11::to_string<250ul>
          (string *__return_storage_ptr__,v11 *this,
          basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *buf)

{
  long lVar1;
  long lVar2;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  lVar1 = *(long *)(this + 8);
  local_38 = local_28;
  local_30 = 0;
  local_28[0] = 0;
  std::__cxx11::string::~string((string *)&local_38);
  lVar2 = *(long *)this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,lVar2,lVar1 + lVar2);
  return __return_storage_ptr__;
}

Assistant:

FMT_NODISCARD auto to_string(const basic_memory_buffer<char, SIZE>& buf)
    -> std::string {
  auto size = buf.size();
  detail::assume(size < std::string().max_size());
  return {buf.data(), size};
}